

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

string * cmdline::detail::readable_typename<unsigned_char>(void)

{
  char *pcVar1;
  string *in_RDI;
  allocator local_31;
  string local_30;
  
  pcVar1 = std::type_info::name((type_info *)&unsigned_char::typeinfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,pcVar1,&local_31);
  demangle(in_RDI,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return in_RDI;
}

Assistant:

std::string
            readable_typename()
            {
                return demangle(typeid(T).name());
            }